

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O0

int __thiscall bdHashSpace::printHashSpace(bdHashSpace *this,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_> local_20;
  iterator it;
  ostream *out_local;
  bdHashSpace *this_local;
  
  it._M_node = (_Base_ptr)out;
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_>::_Rb_tree_iterator(&local_20);
  poVar2 = std::operator<<((ostream *)it._M_node,"bdHashSpace::printHashSpace()");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)it._M_node,"--------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_28 = (_Base_ptr)
             std::
             map<bdNodeId,_bdHashSet,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
             ::begin(&this->mHashTable);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<bdNodeId,_bdHashSet,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdHashSet>_>_>
         ::end(&this->mHashTable);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_>::operator->(&local_20);
    bdHashSet::printHashSet(&ppVar3->second,(ostream *)it._M_node);
    std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdHashSet>_>::operator++(&local_20,0);
  }
  poVar2 = std::operator<<((ostream *)it._M_node,"--------------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int     bdHashSpace::printHashSpace(std::ostream &out) {
	std::map<bdNodeId, bdHashSet>::iterator it;
	out << "bdHashSpace::printHashSpace()" << std::endl;
	out << "--------------------------------------------" << std::endl;
	
	for (it = mHashTable.begin(); it != mHashTable.end(); it++) {
		it->second.printHashSet(out);
	}
	out << "--------------------------------------------" << std::endl;
	return 1;
}